

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O0

void Of_ManPrintQuit(Of_Man_t *p)

{
  double dVar1;
  double dVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  abctime aVar6;
  double dVar7;
  double local_28;
  float MemTt;
  float MemCuts;
  float MemMan;
  float MemGia;
  Of_Man_t *p_local;
  
  dVar7 = Gia_ManMemory(p->pGia);
  iVar5 = Gia_ManObjNum(p->pGia);
  fVar3 = ((float)iVar5 * 32.0) / 1048576.0;
  iVar5 = Vec_PtrSize(&p->vPages);
  fVar4 = ((float)iVar5 * 262144.0) / 1048576.0;
  if (p->vTtMem == (Vec_Mem_t *)0x0) {
    local_28 = 0.0;
  }
  else {
    local_28 = Vec_MemMemory(p->vTtMem);
    local_28 = local_28 / 1048576.0;
  }
  if ((p->CutCount[0] == 0.0) && (!NAN(p->CutCount[0]))) {
    p->CutCount[0] = 1.0;
  }
  if (p->pPars->fVerbose != 0) {
    printf("CutPair = %.0f  ",p->CutCount[0]);
    dVar1 = p->CutCount[1];
    dVar2 = p->CutCount[1];
    iVar5 = Gia_ManAndNum(p->pGia);
    printf("Merge = %.0f (%.1f)  ",dVar1,(dVar2 * 1.0) / (double)iVar5);
    dVar1 = p->CutCount[2];
    dVar2 = p->CutCount[2];
    iVar5 = Gia_ManAndNum(p->pGia);
    printf("Eval = %.0f (%.1f)  ",dVar1,(dVar2 * 1.0) / (double)iVar5);
    dVar1 = p->CutCount[3];
    dVar2 = p->CutCount[3];
    iVar5 = Gia_ManAndNum(p->pGia);
    printf("Cut = %.0f (%.1f)  ",dVar1,(dVar2 * 1.0) / (double)iVar5);
    printf("\n");
    printf("Gia = %.2f MB  ",(double)(float)(dVar7 / 1048576.0));
    printf("Man = %.2f MB  ",(double)fVar3);
    printf("Cut = %.2f MB   ",(double)fVar4);
    if (p->pPars->fCutMin != 0) {
      printf("TT = %.2f MB  ",(double)(float)local_28);
    }
    printf("Total = %.2f MB   ",
           (double)((float)(dVar7 / 1048576.0) + fVar3 + fVar4 + (float)local_28));
    aVar6 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar6 - p->clkStart);
    fflush(_stdout);
  }
  return;
}

Assistant:

void Of_ManPrintQuit( Of_Man_t * p )
{
    float MemGia  = Gia_ManMemory(p->pGia) / (1<<20);
    float MemMan  = 1.0 * sizeof(Of_Obj_t) * Gia_ManObjNum(p->pGia) / (1<<20);
    float MemCuts = 1.0 * sizeof(int) * (1 << 16) * Vec_PtrSize(&p->vPages) / (1<<20);
    float MemTt   = p->vTtMem ? Vec_MemMemory(p->vTtMem) / (1<<20) : 0;
    if ( p->CutCount[0] == 0 )
        p->CutCount[0] = 1;
    if ( !p->pPars->fVerbose )
        return;
    printf( "CutPair = %.0f  ",         p->CutCount[0] );
    printf( "Merge = %.0f (%.1f)  ",    p->CutCount[1], 1.0*p->CutCount[1]/Gia_ManAndNum(p->pGia) );
    printf( "Eval = %.0f (%.1f)  ",     p->CutCount[2], 1.0*p->CutCount[2]/Gia_ManAndNum(p->pGia) );
    printf( "Cut = %.0f (%.1f)  ",      p->CutCount[3], 1.0*p->CutCount[3]/Gia_ManAndNum(p->pGia) );
//    printf( "Use = %.0f (%.1f)  ",      p->CutCount[4], 1.0*p->CutCount[4]/Gia_ManAndNum(p->pGia) );
//    printf( "Mat = %.0f (%.1f)  ",      p->CutCount[5], 1.0*p->CutCount[5]/Gia_ManAndNum(p->pGia) );
//    printf( "Equ = %d (%.2f %%)  ",     p->nCutUseAll,  100.0*p->nCutUseAll /p->CutCount[0] );
    printf( "\n" );
    printf( "Gia = %.2f MB  ",          MemGia );
    printf( "Man = %.2f MB  ",          MemMan ); 
    printf( "Cut = %.2f MB   ",         MemCuts );
    if ( p->pPars->fCutMin )
    printf( "TT = %.2f MB  ",           MemTt ); 
    printf( "Total = %.2f MB   ",       MemGia + MemMan + MemCuts + MemTt ); 
//    printf( "\n" );
    Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
    fflush( stdout );
}